

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsWindowsPEObjdumpGetRuntimeDependenciesTool.cxx
# Opt level: O1

bool __thiscall
cmBinUtilsWindowsPEObjdumpGetRuntimeDependenciesTool::GetFileInfo
          (cmBinUtilsWindowsPEObjdumpGetRuntimeDependenciesTool *this,string *file,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *needed)

{
  cmRuntimeDependencyArchive *this_00;
  string *psVar1;
  cmBinUtilsWindowsPEGetRuntimeDependenciesTool *this_01;
  bool bVar2;
  int iVar3;
  istream *is;
  cmUVProcessChain process;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_> status
  ;
  ostringstream e;
  cmUVProcessChainBuilder builder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  undefined1 local_240 [16];
  StdioConfiguration local_230;
  undefined1 local_228;
  undefined7 uStack_227;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  string *local_200;
  cmBinUtilsWindowsPEGetRuntimeDependenciesTool *local_1f8;
  vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
  local_1f0;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8 [4];
  char *local_180;
  ios_base local_168 [264];
  cmUVProcessChainBuilder local_60;
  
  cmUVProcessChainBuilder::cmUVProcessChainBuilder(&local_60);
  cmUVProcessChainBuilder::SetBuiltinStream(&local_60,Stream_OUTPUT);
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->super_cmBinUtilsWindowsPEGetRuntimeDependenciesTool).Archive;
  local_1d8._0_8_ = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"objdump","");
  bVar2 = cmRuntimeDependencyArchive::GetGetRuntimeDependenciesCommand
                    (this_00,(string *)local_1d8,&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._0_8_ != local_1c8) {
    operator_delete((void *)local_1d8._0_8_,local_1c8[0]._M_allocated_capacity + 1);
  }
  if (bVar2) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_218,
               (char (*) [3])"-p");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_218,file);
    cmUVProcessChainBuilder::AddCommand(&local_60,&local_218);
    cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)local_240);
    bVar2 = cmUVProcessChain::Valid((cmUVProcessChain *)local_240);
    if (bVar2) {
      local_240._8_8_ = &local_228;
      local_230.Type = None;
      local_230.FileDescriptor = 0;
      local_228 = 0;
      local_200 = file;
      local_1f8 = &this->super_cmBinUtilsWindowsPEGetRuntimeDependenciesTool;
      if (GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
          ::regex == '\0') {
        iVar3 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                     ::regex);
        if (iVar3 != 0) {
          GetFileInfo::regex.regmust = (char *)0x0;
          GetFileInfo::regex.program = (char *)0x0;
          GetFileInfo::regex.progsize = 0;
          memset(&GetFileInfo::regex,0,0xaa);
          cmsys::RegularExpression::compile
                    (&GetFileInfo::regex,"^\t*DLL Name: ([^\n]*\\.[Dd][Ll][Ll])$");
          __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::regex,
                       &__dso_handle);
          __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                               ::regex);
        }
      }
      while( true ) {
        is = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_240);
        bVar2 = cmsys::SystemTools::GetLineFromStream
                          (is,(string *)(local_240 + 8),(bool *)0x0,0xffffffffffffffff);
        if (!bVar2) break;
        memset((RegularExpressionMatch *)local_1d8,0,0xa8);
        bVar2 = cmsys::RegularExpression::find
                          (&GetFileInfo::regex,(char *)local_240._8_8_,
                           (RegularExpressionMatch *)local_1d8);
        if (bVar2) {
          if ((char *)local_1d8._8_8_ == (char *)0x0) {
            local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
            local_260._M_string_length = 0;
            local_260.field_2._M_local_buf[0] = '\0';
          }
          else {
            local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_260,local_1d8._8_8_,local_180);
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)needed,
                     &local_260);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p,
                            CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                     local_260.field_2._M_local_buf[0]) + 1);
          }
        }
      }
      bVar2 = cmUVProcessChain::Wait((cmUVProcessChain *)local_240,-1);
      this_01 = local_1f8;
      psVar1 = local_200;
      if (bVar2) {
        cmUVProcessChain::GetStatus(&local_1f0,(cmUVProcessChain *)local_240);
        if ((*local_1f0.
              super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
              ._M_impl.super__Vector_impl_data._M_start == (Status *)0x0) ||
           ((*local_1f0.
              super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
              ._M_impl.super__Vector_impl_data._M_start)->ExitStatus != 0)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d8,"Failed to run objdump on:\n  ",0x1c);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d8,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
          std::__cxx11::stringbuf::str();
          cmBinUtilsWindowsPEGetRuntimeDependenciesTool::SetError(this_01,&local_260);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p,
                            CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                     local_260.field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
          std::ios_base::~ios_base(local_168);
          bVar2 = false;
        }
        else {
          bVar2 = true;
        }
        if (local_1f0.
            super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f0.
                          super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f0.
                                super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f0.
                                super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,"Failed to wait on objdump process for:\n  ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
        std::__cxx11::stringbuf::str();
        cmBinUtilsWindowsPEGetRuntimeDependenciesTool::SetError(this_01,&local_260);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,
                          CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                   local_260.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
        std::ios_base::~ios_base(local_168);
        bVar2 = false;
      }
      if ((undefined1 *)local_240._8_8_ != &local_228) {
        operator_delete((void *)local_240._8_8_,CONCAT71(uStack_227,local_228) + 1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"Failed to start objdump process for:\n  ",0x27);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,(file->_M_dataplus)._M_p,file->_M_string_length);
      std::__cxx11::stringbuf::str();
      cmBinUtilsWindowsPEGetRuntimeDependenciesTool::SetError
                (&this->super_cmBinUtilsWindowsPEGetRuntimeDependenciesTool,
                 (string *)(local_240 + 8));
      if ((undefined1 *)local_240._8_8_ != &local_228) {
        operator_delete((void *)local_240._8_8_,CONCAT71(uStack_227,local_228) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
      std::ios_base::~ios_base(local_168);
      bVar2 = false;
    }
    cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)local_240);
  }
  else {
    local_1d8._0_8_ = local_1c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Could not find objdump","")
    ;
    cmBinUtilsWindowsPEGetRuntimeDependenciesTool::SetError
              (&this->super_cmBinUtilsWindowsPEGetRuntimeDependenciesTool,(string *)local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._0_8_ != local_1c8) {
      operator_delete((void *)local_1d8._0_8_,local_1c8[0]._M_allocated_capacity + 1);
    }
    bVar2 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_218);
  std::
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ::~vector(&local_60.Processes);
  return bVar2;
}

Assistant:

bool cmBinUtilsWindowsPEObjdumpGetRuntimeDependenciesTool::GetFileInfo(
  const std::string& file, std::vector<std::string>& needed)
{
  cmUVProcessChainBuilder builder;
  builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT);

  std::vector<std::string> command;
  if (!this->Archive->GetGetRuntimeDependenciesCommand("objdump", command)) {
    this->SetError("Could not find objdump");
    return false;
  }
  command.emplace_back("-p");
  command.push_back(file);
  builder.AddCommand(command);

  auto process = builder.Start();
  if (!process.Valid()) {
    std::ostringstream e;
    e << "Failed to start objdump process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  std::string line;
  static const cmsys::RegularExpression regex(
    "^\t*DLL Name: ([^\n]*\\.[Dd][Ll][Ll])$");
  while (cmSystemTools::GetLineFromStream(*process.OutputStream(), line)) {
    cmsys::RegularExpressionMatch match;
    if (regex.find(line.c_str(), match)) {
      needed.push_back(match.match(1));
    }
  }

  if (!process.Wait()) {
    std::ostringstream e;
    e << "Failed to wait on objdump process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }
  auto status = process.GetStatus();
  if (!status[0] || status[0]->ExitStatus != 0) {
    std::ostringstream e;
    e << "Failed to run objdump on:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  return true;
}